

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

void __thiscall
slang::ast::PackedArrayType::PackedArrayType
          (PackedArrayType *this,Type *elementType,ConstantRange range,bitwidth_t fullWidth)

{
  SourceLocation loc;
  string_view name;
  undefined4 in_ECX;
  char *in_RDX;
  size_t in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  Type *in_stack_00000008;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  bitwidth_t in_stack_ffffffffffffffd0;
  SymbolKind in_stack_ffffffffffffffd4;
  IntegralType *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  
  pbVar1 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  SourceLocation::SourceLocation((SourceLocation *)&stack0xffffffffffffffc8);
  Type::isSigned((Type *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  Type::isFourState(in_stack_00000008);
  name._M_str = (char *)pbVar1;
  name._M_len = in_RSI;
  loc._4_4_ = in_ECX;
  loc._0_4_ = in_stack_ffffffffffffffe0;
  IntegralType::IntegralType
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,name,loc,in_stack_ffffffffffffffd0,
             (bool)in_stack_ffffffffffffffcf,(bool)in_stack_ffffffffffffffce);
  in_RDI[5]._M_len = in_RSI;
  in_RDI[5]._M_str = in_RDX;
  return;
}

Assistant:

PackedArrayType::PackedArrayType(const Type& elementType, ConstantRange range,
                                 bitwidth_t fullWidth) :
    IntegralType(SymbolKind::PackedArrayType, "", SourceLocation(), fullWidth,
                 elementType.isSigned(), elementType.isFourState()),
    elementType(elementType), range(range) {
}